

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O0

void __thiscall DIS::DetonationPdu::~DetonationPdu(DetonationPdu *this)

{
  DetonationPdu *this_local;
  
  (this->super_WarfareFamilyPdu).super_Pdu._vptr_Pdu = (_func_int **)&PTR__DetonationPdu_00271a98;
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::clear
            (&this->_articulationParameters);
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::~vector
            (&this->_articulationParameters);
  Vector3Float::~Vector3Float(&this->_locationInEntityCoordinates);
  BurstDescriptor::~BurstDescriptor(&this->_burstDescriptor);
  Vector3Double::~Vector3Double(&this->_locationInWorldCoordinates);
  Vector3Float::~Vector3Float(&this->_velocity);
  EventID::~EventID(&this->_eventID);
  EntityID::~EntityID(&this->_munitionID);
  WarfareFamilyPdu::~WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  return;
}

Assistant:

DetonationPdu::~DetonationPdu()
{
    _articulationParameters.clear();
}